

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
MeCab::Param::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Param *this,char *key)

{
  const_iterator cVar1;
  allocator local_59;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> r;
  char *local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  std::__cxx11::string::string((string *)&r,key,&local_59);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->conf_)._M_t,(key_type *)&r);
  std::__cxx11::string::~string((string *)&r);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->conf_)._M_t._M_impl.super__Rb_tree_header) {
    r.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    ((r.ptr_)->_M_dataplus)._M_p = (pointer)&(r.ptr_)->field_2;
    (r.ptr_)->_M_string_length = 0;
    ((r.ptr_)->field_2)._M_local_buf[0] = '\0';
    r._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_0019ecf8;
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)r.ptr_);
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&r);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,(string *)(cVar1._M_node + 2));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_38 == &local_28) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_20;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_38;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
    }
    __return_storage_ptr__->_M_string_length = local_30;
    local_30 = 0;
    local_28 = '\0';
    local_38 = &local_28;
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

T get(const char *key) const {
    std::map<std::string, std::string>::const_iterator it = conf_.find(key);
    if (it == conf_.end()) {
      scoped_ptr<T> r(new T());
      return *r;
    }
    return lexical_cast<T, std::string>(it->second);
  }